

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

int __thiscall deqp::gles31::Functional::UniformCase::init(UniformCase *this,EVP_PKEY_CTX *ctx)

{
  UniformCollection *pUVar1;
  pointer pUVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  NotSupportedError *pNVar6;
  long *plVar7;
  size_type *psVar8;
  uint uVar9;
  ulong uVar10;
  VarType *type;
  int combinedTexUnitsRequired;
  int fragmentTexUnitsRequired;
  int vertexTexUnitsRequired;
  int val;
  int combinedTexUnitsSupported;
  int fragmentTexUnitsSupported;
  int vertexTexUnitsSupported;
  int local_ec;
  int local_e8;
  int local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  int local_7c;
  int local_78;
  int local_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar5;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  pUVar1 = (this->m_uniformCollection).m_ptr;
  pUVar2 = (pUVar1->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (int)((long)(pUVar1->m_uniforms).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 3) * -0x49249249;
  local_e8 = 0;
  if (0 < (int)uVar9) {
    uVar10 = (ulong)(uVar9 & 0x7fffffff);
    type = &pUVar2->type;
    local_e8 = 0;
    do {
      iVar4 = getNumSamplersInType(type);
      local_e8 = local_e8 + iVar4;
      type = (VarType *)&type[2].m_data;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  local_e4 = 0;
  if (this->m_caseShaderType != CASESHADERTYPE_FRAGMENT) {
    local_e4 = local_e8;
  }
  if (this->m_caseShaderType == CASESHADERTYPE_VERTEX) {
    local_e8 = 0;
  }
  local_ec = local_e8 + local_e4;
  local_c0._M_dataplus._M_p._0_4_ = -1;
  (**(code **)(lVar5 + 0x868))(0x8b4c,&local_c0);
  iVar4 = (int)local_c0._M_dataplus._M_p;
  local_74 = (int)local_c0._M_dataplus._M_p;
  local_c0._M_dataplus._M_p._0_4_ = -1;
  (**(code **)(lVar5 + 0x868))(0x8872,&local_c0);
  iVar3 = (int)local_c0._M_dataplus._M_p;
  local_78 = (int)local_c0._M_dataplus._M_p;
  local_c0._M_dataplus._M_p._0_4_ = 0xffffffff;
  (**(code **)(lVar5 + 0x868))(0x8b4d,&local_c0);
  local_7c = (int)local_c0._M_dataplus._M_p;
  if (iVar4 < local_e4) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_a0,&local_e4);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_e0._M_dataplus._M_p == psVar8) {
      local_e0.field_2._M_allocated_capacity = *psVar8;
      local_e0.field_2._8_8_ = plVar7[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar8;
    }
    local_e0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    de::toString<int>(&local_70,&local_74);
    std::operator+(&local_50,&local_e0,&local_70);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_c0._M_dataplus._M_p = (pointer)*plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_c0._M_dataplus._M_p == psVar8) {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0.field_2._8_8_ = plVar7[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar8;
    }
    local_c0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_c0);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (iVar3 < local_e8) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_a0,&local_e8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_e0._M_dataplus._M_p == psVar8) {
      local_e0.field_2._M_allocated_capacity = *psVar8;
      local_e0.field_2._8_8_ = plVar7[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar8;
    }
    local_e0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    de::toString<int>(&local_70,&local_78);
    std::operator+(&local_50,&local_e0,&local_70);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_c0._M_dataplus._M_p = (pointer)*plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_c0._M_dataplus._M_p == psVar8) {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0.field_2._8_8_ = plVar7[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar8;
    }
    local_c0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError(pNVar6,&local_c0);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (local_ec <= (int)local_c0._M_dataplus._M_p) {
    (this->super_CallLogWrapper).m_enableLog = true;
    return (int)local_c0._M_dataplus._M_p;
  }
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>(&local_a0,&local_ec);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
  local_e0._M_dataplus._M_p = (pointer)*plVar7;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_e0._M_dataplus._M_p == psVar8) {
    local_e0.field_2._M_allocated_capacity = *psVar8;
    local_e0.field_2._8_8_ = plVar7[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar8;
  }
  local_e0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  de::toString<int>(&local_70,&local_7c);
  std::operator+(&local_50,&local_e0,&local_70);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_c0._M_dataplus._M_p = (pointer)*plVar7;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_c0._M_dataplus._M_p == psVar8) {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0.field_2._8_8_ = plVar7[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar8;
  }
  local_c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(pNVar6,&local_c0);
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UniformCase::init (void)
{
	{
		const glw::Functions&	funcs						= m_context.getRenderContext().getFunctions();
		const int				numSamplerUniforms			= m_uniformCollection->getNumSamplers();
		const int				vertexTexUnitsRequired		= m_caseShaderType != CASESHADERTYPE_FRAGMENT ? numSamplerUniforms : 0;
		const int				fragmentTexUnitsRequired	= m_caseShaderType != CASESHADERTYPE_VERTEX ? numSamplerUniforms : 0;
		const int				combinedTexUnitsRequired	= vertexTexUnitsRequired + fragmentTexUnitsRequired;
		const int				vertexTexUnitsSupported		= getGLInt(funcs, GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS);
		const int				fragmentTexUnitsSupported	= getGLInt(funcs, GL_MAX_TEXTURE_IMAGE_UNITS);
		const int				combinedTexUnitsSupported	= getGLInt(funcs, GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS);

		DE_ASSERT(numSamplerUniforms <= MAX_NUM_SAMPLER_UNIFORMS);

		if (vertexTexUnitsRequired > vertexTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(vertexTexUnitsRequired) + " vertex texture units required, " + de::toString(vertexTexUnitsSupported) + " supported");
		if (fragmentTexUnitsRequired > fragmentTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(fragmentTexUnitsRequired) + " fragment texture units required, " + de::toString(fragmentTexUnitsSupported) + " supported");
		if (combinedTexUnitsRequired > combinedTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(combinedTexUnitsRequired) + " combined texture units required, " + de::toString(combinedTexUnitsSupported) + " supported");
	}

	enableLogging(true);
}